

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void Fl::add_check(Fl_Timeout_Handler cb,void *argp)

{
  Check *local_20;
  Check *t;
  void *argp_local;
  Fl_Timeout_Handler cb_local;
  
  local_20 = free_check;
  if (free_check == (Check *)0x0) {
    local_20 = (Check *)operator_new(0x18);
  }
  else {
    free_check = free_check->next;
  }
  local_20->cb = cb;
  local_20->arg = argp;
  local_20->next = first_check;
  if (next_check == first_check) {
    next_check = local_20;
  }
  first_check = local_20;
  return;
}

Assistant:

void Fl::add_check(Fl_Timeout_Handler cb, void *argp) {
  Check* t = free_check;
  if (t) free_check = t->next;
  else t = new Check;
  t->cb = cb;
  t->arg = argp;
  t->next = first_check;
  if (next_check == first_check) next_check = t;
  first_check = t;
}